

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgOneDimensionalWrapper.hpp
# Opt level: O3

vector<int,_std::allocator<int>_> * __thiscall
TasGrid::OneDimensionalWrapper::getLevels
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,OneDimensionalWrapper *this,
          vector<int,_std::allocator<int>_> *point)

{
  int iVar1;
  pointer piVar2;
  int *piVar3;
  pointer piVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  int *piVar8;
  allocator_type local_19;
  
  ::std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,
             (long)(point->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(point->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 2,&local_19);
  piVar2 = (point->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  lVar5 = (long)(point->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar2;
  if (lVar5 != 0) {
    lVar5 = lVar5 >> 2;
    piVar3 = (this->num_points).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar6 = 0;
    do {
      iVar7 = -1;
      piVar8 = piVar3;
      do {
        iVar7 = iVar7 + 1;
        iVar1 = *piVar8;
        piVar8 = piVar8 + 1;
      } while (iVar1 <= piVar2[lVar6]);
      piVar4[lVar6] = iVar7;
      lVar6 = lVar6 + 1;
    } while (lVar6 != lVar5 + (ulong)(lVar5 == 0));
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> getLevels(std::vector<int> const &point){
        std::vector<int> result(point.size());
        for(size_t i=0; i<point.size(); i++) result[i] = getLevel(point[i]);
        return result;
    }